

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int32 accum_dump(char *out_dir,model_inventory_t *inv,int32 mixw_reest,int32 tmat_reest,
                int32 mean_reest,int32 var_reest,int32 pass2var,int32 var_is_full,int ckpt)

{
  gauden_t *pgVar1;
  int iVar2;
  int32 iVar3;
  vector_t ***local_1088;
  vector_t ***local_1078;
  vector_t ****local_1068;
  vector_t ***local_1058;
  int local_1044;
  int32 rv;
  gauden_t *g;
  char fn [4097];
  int32 var_reest_local;
  int32 mean_reest_local;
  int32 tmat_reest_local;
  int32 mixw_reest_local;
  model_inventory_t *inv_local;
  char *out_dir_local;
  
  unique0x100002fa = var_reest;
  if (ckpt == 0) {
    accum_stat(inv,mixw_reest);
  }
  pgVar1 = inv->gauden;
  mk_bkp(mixw_reest,tmat_reest,mean_reest,stack0xffffffffffffffd0,out_dir);
  if (mixw_reest == 0) {
    if (ckpt == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
              ,0x380,"Mixture weights not reestimated.  No %s/mixw_counts produced.\n",out_dir);
    }
  }
  else {
    sprintf((char *)&g,"%s/mixw_counts",out_dir);
    iVar2 = s3mixw_write((char *)&g,inv->mixw_acc,inv->n_mixw,pgVar1->n_feat,pgVar1->n_density);
    if (iVar2 != 0) {
      revert_bkp(mixw_reest,tmat_reest,mean_reest,stack0xffffffffffffffd0,out_dir);
      return -1;
    }
  }
  if (tmat_reest == 0) {
    if (ckpt == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
              ,0x397,"Transition matrices not reestimated.  No %s/tmat_counts produced.\n",out_dir);
    }
  }
  else {
    sprintf((char *)&g,"%s/tmat_counts",out_dir);
    iVar2 = s3tmat_write((char *)&g,inv->tmat_acc,inv->n_tmat,inv->n_state_pm);
    if (iVar2 != 0) {
      revert_bkp(mixw_reest,tmat_reest,mean_reest,stack0xffffffffffffffd0,out_dir);
      return -1;
    }
  }
  if ((mean_reest == 0) && (stack0xffffffffffffffd0 == 0)) {
    if (ckpt == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
              ,0x3c0,"means and variances not reestimated.  No %s/gauden_counts produced.\n",out_dir
             );
    }
  }
  else {
    sprintf((char *)&g,"%s/gauden_counts",out_dir);
    if (var_is_full == 0) {
      if (mean_reest == 0) {
        local_1078 = (vector_t ***)0x0;
      }
      else {
        local_1078 = pgVar1->macc;
      }
      if (stack0xffffffffffffffd0 == 0) {
        local_1088 = (vector_t ***)0x0;
      }
      else {
        local_1088 = pgVar1->vacc;
      }
      local_1044 = s3gaucnt_write((char *)&g,local_1078,local_1088,pass2var,pgVar1->dnom,
                                  pgVar1->n_mgau,pgVar1->n_feat,pgVar1->n_density,pgVar1->veclen);
    }
    else {
      if (mean_reest == 0) {
        local_1058 = (vector_t ***)0x0;
      }
      else {
        local_1058 = pgVar1->macc;
      }
      if (stack0xffffffffffffffd0 == 0) {
        local_1068 = (vector_t ****)0x0;
      }
      else {
        local_1068 = pgVar1->fullvacc;
      }
      local_1044 = s3gaucnt_write_full((char *)&g,local_1058,local_1068,pass2var,pgVar1->dnom,
                                       pgVar1->n_mgau,pgVar1->n_feat,pgVar1->n_density,
                                       pgVar1->veclen);
    }
    if (local_1044 != 0) {
      revert_bkp(mixw_reest,tmat_reest,mean_reest,stack0xffffffffffffffd0,out_dir);
      return -1;
    }
  }
  iVar3 = commit(mixw_reest,tmat_reest,mean_reest,stack0xffffffffffffffd0,ckpt,out_dir);
  return iVar3;
}

Assistant:

int32
accum_dump(const char *out_dir,
	   model_inventory_t *inv,
	   int32 mixw_reest,
	   int32 tmat_reest,
	   int32 mean_reest,
	   int32 var_reest,
	   int32 pass2var,
	   int32 var_is_full,
	   int ckpt)  	    /* checkpoint dump flag */
{
    char fn[MAXPATHLEN+1];
    gauden_t *g;

    /* run over the accumulators and report anything exceptional */
    if (!ckpt)
	accum_stat(inv, mixw_reest);

    g = inv->gauden;

    mk_bkp(mixw_reest, tmat_reest, mean_reest, var_reest, out_dir);

    if (mixw_reest) {
	sprintf(fn, "%s/mixw_counts", out_dir);

	if (s3mixw_write(fn,
			 inv->mixw_acc,
			 inv->n_mixw,
			 g->n_feat,
			 g->n_density) != S3_SUCCESS) {

	    revert_bkp(mixw_reest,
		       tmat_reest,
		       mean_reest,
		       var_reest,
		       out_dir);

	    return S3_ERROR;
	}
    }
    else {
	if (!ckpt)
	    E_INFO("Mixture weights not reestimated.  "
		   "No %s/mixw_counts produced.\n",
		   out_dir);
    }

    if (tmat_reest) {
	sprintf(fn, "%s/tmat_counts", out_dir);
	if (s3tmat_write(fn,
			 inv->tmat_acc,
			 inv->n_tmat,
			 inv->n_state_pm) != S3_SUCCESS) {

	    revert_bkp(mixw_reest,
		       tmat_reest,
		       mean_reest,
		       var_reest,
		       out_dir);

	    return S3_ERROR;
	}
    }
    else {
	if (!ckpt)
	    E_INFO("Transition matrices not reestimated.  "
		   "No %s/tmat_counts produced.\n",
		   out_dir);
    }
    
    if (mean_reest || var_reest) {
	int32 rv;

	sprintf(fn, "%s/gauden_counts", out_dir);
	if (var_is_full)
	    rv = s3gaucnt_write_full(fn,
				(mean_reest ? g->macc : NULL),
				(var_reest ? g->fullvacc : NULL),
				pass2var,
				g->dnom,
				g->n_mgau,
				g->n_feat,
				g->n_density,
				g->veclen);
	else
	    rv = s3gaucnt_write(fn,
				(mean_reest ? g->macc : NULL),
				(var_reest ? g->vacc : NULL),
				pass2var,
				g->dnom,
				g->n_mgau,
				g->n_feat,
				g->n_density,
				g->veclen);
	if (rv != S3_SUCCESS) {
	    revert_bkp(mixw_reest,
		       tmat_reest,
		       mean_reest,
		       var_reest,
		       out_dir);

	    return S3_ERROR;
	}
    }
    else {
	if (!ckpt)
	    E_INFO("means and variances not reestimated.  "
		   "No %s/gauden_counts produced.\n",
		   out_dir);
    }
    
    return commit(mixw_reest,
		  tmat_reest,
		  mean_reest,
		  var_reest,
		  ckpt,
		  out_dir);
}